

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_assembler.c
# Opt level: O1

int parse_args_DEFB(Context_conflict *ctx)

{
  bool bVar1;
  Token TVar2;
  int iVar3;
  uint32 uVar4;
  
  parse_destination_token(ctx);
  require_comma(ctx);
  TVar2 = nexttoken(ctx);
  if (TVar2 == TOKEN_IDENTIFIER) {
    iVar3 = check_token_segment(ctx,"true");
    uVar4 = 1;
    if (iVar3 == 0) {
      iVar3 = check_token_segment(ctx,"false");
      bVar1 = false;
      uVar4 = 0;
      if (iVar3 == 0) goto LAB_00123dc9;
    }
    iVar3 = ctx->tokenbufpos;
    ctx->tokenbufpos = iVar3 + 1;
    ctx->tokenbuf[iVar3] = uVar4;
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
LAB_00123dc9:
  if ((!bVar1) || (ctx->tokenlen != 0)) {
    failf(ctx,"%s","Expected \'true\' or \'false\'");
  }
  return 3;
}

Assistant:

static int parse_args_DEFB(Context *ctx)
{
    parse_destination_token(ctx);
    require_comma(ctx);

    // !!! FIXME: do a TOKEN_TRUE and TOKEN_FALSE? Is this case-sensitive?
    const Token token = nexttoken(ctx);

    int bad = 0;
    if (token != TOKEN_IDENTIFIER)
        bad = 1;
    else if (check_token_segment(ctx, "true"))
        ctx->tokenbuf[ctx->tokenbufpos++] = 1;
    else if (check_token_segment(ctx, "false"))
        ctx->tokenbuf[ctx->tokenbufpos++] = 0;
    else
        bad = 1;

    if (ctx->tokenlen != 0)
        bad = 1;

    if (bad)
        fail(ctx, "Expected 'true' or 'false'");

    return 3;
}